

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O0

int archive_set_format_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  archive_write *a;
  int local_4;
  
  if (*(long *)(in_RDI + 0xd8) == 0) {
    local_4 = -0x15;
    if (in_RSI == (char *)0x0) {
      local_4 = -0x19;
    }
  }
  else if ((in_RSI == (char *)0x0) || (iVar1 = strcmp(in_RSI,*(char **)(in_RDI + 0xd8)), iVar1 == 0)
          ) {
    if (*(long *)(in_RDI + 0xe8) == 0) {
      local_4 = -0x14;
    }
    else {
      local_4 = (**(code **)(in_RDI + 0xe8))(in_RDI,in_RDX,in_RCX);
    }
  }
  else {
    local_4 = -0x15;
  }
  return local_4;
}

Assistant:

static int
archive_set_format_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_format_descriptor *format;
	size_t i;
	int r, rv = ARCHIVE_WARN, matched_modules = 0;

	for (i = 0; i < sizeof(a->formats)/sizeof(a->formats[0]); i++) {
		format = &a->formats[i];
		if (format == NULL || format->options == NULL ||
		    format->name == NULL)
			/* This format does not support option. */
			continue;
		if (m != NULL) {
			if (strcmp(format->name, m) != 0)
				continue;
			++matched_modules;
		}

		a->format = format;
		r = format->options(a, o, v);
		a->format = NULL;

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the format name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && matched_modules == 0)
		return ARCHIVE_WARN - 1;
	return (rv);
}